

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.h
# Opt level: O2

bool __thiscall cmSearchPath::PathWithPrefix::operator<(PathWithPrefix *this,PathWithPrefix *other)

{
  bool bVar1;
  __type _Var2;
  bool bVar3;
  
  bVar1 = std::operator<(&this->Path,&other->Path);
  bVar3 = true;
  if (!bVar1) {
    _Var2 = std::operator==(&this->Path,&other->Path);
    if (_Var2) {
      bVar1 = std::operator<(&this->Prefix,&other->Prefix);
      return bVar1;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator<(const PathWithPrefix& other) const
    {
      return this->Path < other.Path ||
        (this->Path == other.Path && this->Prefix < other.Prefix);
    }